

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::SetupProperties(PretransformVertices *this,Importer *pImp)

{
  int iVar1;
  aiMatrix4x4 local_98;
  aiMatrix4x4 local_58;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"PP_PTV_KEEP_HIERARCHY",0);
  this->configKeepHierarchy = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"PP_PTV_NORMALIZE",0);
  this->configNormalize = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"PP_PTV_ADD_ROOT_TRANSFORMATION",0);
  this->configTransform = iVar1 != 0;
  local_98.a1 = 1.0;
  local_98.a2 = 0.0;
  local_98.a3 = 0.0;
  local_98.a4 = 0.0;
  local_98.b1 = 0.0;
  local_98.b2 = 1.0;
  local_98.b3 = 0.0;
  local_98.b4 = 0.0;
  local_98.c1 = 0.0;
  local_98.c2 = 0.0;
  local_98.c3 = 1.0;
  local_98.c4 = 0.0;
  local_98.d1 = 0.0;
  local_98.d2 = 0.0;
  local_98.d3 = 0.0;
  local_98.d4 = 1.0;
  Importer::GetPropertyMatrix(&local_58,pImp,"PP_PTV_ROOT_TRANSFORMATION",&local_98);
  (this->configTransformation).d1 = local_58.d1;
  (this->configTransformation).d2 = local_58.d2;
  (this->configTransformation).d3 = local_58.d3;
  (this->configTransformation).d4 = local_58.d4;
  (this->configTransformation).c1 = local_58.c1;
  (this->configTransformation).c2 = local_58.c2;
  (this->configTransformation).c3 = local_58.c3;
  (this->configTransformation).c4 = local_58.c4;
  (this->configTransformation).b1 = local_58.b1;
  (this->configTransformation).b2 = local_58.b2;
  (this->configTransformation).b3 = local_58.b3;
  (this->configTransformation).b4 = local_58.b4;
  (this->configTransformation).a1 = local_58.a1;
  (this->configTransformation).a2 = local_58.a2;
  (this->configTransformation).a3 = local_58.a3;
  (this->configTransformation).a4 = local_58.a4;
  iVar1 = Importer::GetPropertyInteger(pImp,"EXPORT_POINT_CLOUDS",0);
  this->mConfigPointCloud = iVar1 != 0;
  return;
}

Assistant:

void PretransformVertices::SetupProperties(const Importer* pImp)
{
    // Get the current value of AI_CONFIG_PP_PTV_KEEP_HIERARCHY, AI_CONFIG_PP_PTV_NORMALIZE,
    // AI_CONFIG_PP_PTV_ADD_ROOT_TRANSFORMATION and AI_CONFIG_PP_PTV_ROOT_TRANSFORMATION
    configKeepHierarchy = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_KEEP_HIERARCHY,0));
    configNormalize = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_NORMALIZE,0));
    configTransform = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_ADD_ROOT_TRANSFORMATION,0));

    configTransformation = pImp->GetPropertyMatrix(AI_CONFIG_PP_PTV_ROOT_TRANSFORMATION, aiMatrix4x4());

    mConfigPointCloud = pImp->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
}